

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_alloc.c
# Opt level: O3

void * lj_alloc_free(void *msp,void *ptr)

{
  int iVar1;
  ulong uVar2;
  long *__addr;
  uint uVar3;
  ulong *puVar4;
  int iVar5;
  void *in_RAX;
  ulong *puVar6;
  undefined4 extraout_var;
  size_t sVar7;
  void *pvVar8;
  int *piVar9;
  msegmentptr sp;
  ulong *puVar10;
  long *plVar11;
  uint uVar12;
  ulong *puVar13;
  long *plVar14;
  long lVar15;
  byte bVar16;
  ulong uVar17;
  long lVar18;
  ulong uVar19;
  ulong *puVar20;
  ulong *puVar21;
  ulong *puVar22;
  ulong uVar23;
  
  if (ptr == (void *)0x0) {
    return in_RAX;
  }
  puVar6 = (ulong *)((long)ptr + -0x10);
  uVar17 = *(ulong *)((long)ptr + -8) & 0xfffffffffffffffc;
  puVar13 = (ulong *)((long)ptr + uVar17);
  puVar20 = puVar13 + -2;
  uVar23 = uVar17;
  if ((*(ulong *)((long)ptr + -8) & 1) == 0) {
    uVar19 = *puVar6;
    if ((uVar19 & 1) != 0) {
      piVar9 = __errno_location();
      iVar1 = *piVar9;
      iVar5 = munmap((void *)((long)puVar6 - (uVar19 & 0xfffffffffffffffe)),
                     uVar17 + (uVar19 & 0xfffffffffffffffe) + 0x20);
      *piVar9 = iVar1;
      return (void *)CONCAT44(extraout_var,iVar5);
    }
    puVar6 = (ulong *)((long)puVar6 - uVar19);
    uVar23 = uVar19 + uVar17;
    if (puVar6 == *(ulong **)((long)msp + 0x18)) {
      uVar19 = puVar13[-1];
      if ((~(uint)uVar19 & 3) == 0) {
        *(ulong *)((long)msp + 8) = uVar23;
        puVar13[-1] = uVar19 & 0xfffffffffffffffe;
        puVar6[1] = uVar23 | 1;
        *puVar20 = uVar23;
        return puVar6;
      }
    }
    else {
      puVar10 = (ulong *)puVar6[3];
      if (uVar19 < 0x100) {
        puVar22 = (ulong *)puVar6[2];
        if (puVar22 == puVar10) {
          bVar16 = (byte)(uVar19 >> 3) & 0x1f;
          *(uint *)msp = *msp & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
        }
        else {
          puVar22[3] = (ulong)puVar10;
          puVar10[2] = (ulong)puVar22;
        }
      }
      else {
        uVar19 = puVar6[6];
        if (puVar10 == puVar6) {
          if ((ulong *)puVar6[5] == (ulong *)0x0) {
            if ((ulong *)puVar6[4] == (ulong *)0x0) {
              puVar10 = (ulong *)0x0;
              goto LAB_00141216;
            }
            puVar22 = (ulong *)puVar6[4];
            puVar4 = puVar6 + 4;
          }
          else {
            puVar22 = (ulong *)puVar6[5];
            puVar4 = puVar6 + 5;
          }
          do {
            do {
              puVar21 = puVar4;
              puVar10 = puVar22;
              puVar22 = (ulong *)puVar10[5];
              puVar4 = puVar10 + 5;
            } while ((ulong *)puVar10[5] != (ulong *)0x0);
            puVar22 = (ulong *)puVar10[4];
            puVar4 = puVar10 + 4;
          } while ((ulong *)puVar10[4] != (ulong *)0x0);
          *puVar21 = 0;
        }
        else {
          uVar2 = puVar6[2];
          *(ulong **)(uVar2 + 0x18) = puVar10;
          puVar10[2] = uVar2;
        }
LAB_00141216:
        if (uVar19 != 0) {
          uVar2 = puVar6[7];
          if (puVar6 == *(ulong **)((long)msp + uVar2 * 8 + 0x248)) {
            *(ulong **)((long)msp + uVar2 * 8 + 0x248) = puVar10;
            if (puVar10 != (ulong *)0x0) goto LAB_0014124b;
            bVar16 = (byte)uVar2 & 0x1f;
            *(uint *)((long)msp + 4) =
                 *(uint *)((long)msp + 4) & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
          }
          else {
            *(ulong **)(uVar19 + 0x20 + (ulong)(*(ulong **)(uVar19 + 0x20) != puVar6) * 8) = puVar10
            ;
            if (puVar10 != (ulong *)0x0) {
LAB_0014124b:
              puVar10[6] = uVar19;
              uVar19 = puVar6[4];
              if (uVar19 != 0) {
                puVar10[4] = uVar19;
                *(ulong **)(uVar19 + 0x30) = puVar10;
              }
              uVar19 = puVar6[5];
              if (uVar19 != 0) {
                puVar10[5] = uVar19;
                *(ulong **)(uVar19 + 0x30) = puVar10;
              }
            }
          }
        }
      }
    }
  }
  uVar17 = *(ulong *)((long)ptr + (uVar17 - 8));
  if ((uVar17 & 2) != 0) {
    puVar13[-1] = uVar17 & 0xfffffffffffffffe;
    puVar6[1] = uVar23 | 1;
    *(ulong *)((long)puVar6 + uVar23) = uVar23;
    goto LAB_001412e7;
  }
  if (puVar20 == *(ulong **)((long)msp + 0x20)) {
    uVar23 = uVar23 + *(long *)((long)msp + 0x10);
    *(ulong *)((long)msp + 0x10) = uVar23;
    *(ulong **)((long)msp + 0x20) = puVar6;
    puVar6[1] = uVar23 | 1;
    if (puVar6 == *(ulong **)((long)msp + 0x18)) {
      *(undefined8 *)((long)msp + 0x18) = 0;
      *(undefined8 *)((long)msp + 8) = 0;
    }
    if (uVar23 <= *(ulong *)((long)msp + 0x28)) {
      return puVar6;
    }
    if (0x40 < uVar23) {
      uVar23 = (uVar23 + 0x1ffbf & 0xfffffffffffe0000) - 0x20000;
      plVar11 = (long *)((long)msp + 0x348);
      plVar14 = plVar11;
      do {
        if (((ulong *)*plVar14 <= puVar6) &&
           (uVar17 = plVar14[1], puVar6 < (ulong *)(*plVar14 + plVar14[1]))) goto LAB_001413e6;
        plVar14 = (long *)plVar14[2];
      } while (plVar14 != (long *)0x0);
      plVar14 = (long *)0x0;
      uVar17 = _DAT_00000008;
LAB_001413e6:
      if (uVar23 <= uVar17) {
        __addr = (long *)*plVar14;
        do {
          uVar19 = 0;
          if (__addr <= plVar11 && plVar11 < (long *)(uVar17 + (long)__addr)) goto LAB_001413f5;
          plVar11 = (long *)plVar11[2];
        } while (plVar11 != (long *)0x0);
        piVar9 = __errno_location();
        iVar1 = *piVar9;
        pvVar8 = mremap(__addr,uVar17,uVar17 - uVar23,0);
        *piVar9 = iVar1;
        if (pvVar8 == (void *)0xffffffffffffffff) {
          iVar5 = munmap((void *)((uVar17 - uVar23) + *plVar14),uVar23);
          *piVar9 = iVar1;
          uVar19 = 0;
          if ((uVar23 == 0) || (iVar5 != 0)) goto LAB_001413f5;
        }
        else if (uVar23 == 0) goto LAB_001413f2;
        plVar14[1] = plVar14[1] - uVar23;
        lVar15 = *(long *)((long)msp + 0x20);
        lVar18 = *(long *)((long)msp + 0x10) - uVar23;
        uVar17 = (ulong)(-(int)lVar15 - 0x10U & 7);
        uVar19 = lVar18 - uVar17;
        *(ulong *)((long)msp + 0x20) = lVar15 + uVar17;
        *(ulong *)((long)msp + 0x10) = uVar19;
        *(ulong *)(lVar15 + 8 + uVar17) = uVar19 | 1;
        *(undefined8 *)(lVar15 + 8 + lVar18) = 0x40;
        *(undefined8 *)((long)msp + 0x28) = 0x200000;
        uVar19 = uVar23;
        goto LAB_001413f5;
      }
    }
LAB_001413f2:
    uVar19 = 0;
LAB_001413f5:
    sVar7 = release_unused_segments((mstate)msp);
    if ((void *)(sVar7 + uVar19) != (void *)0x0) {
      return (void *)(sVar7 + uVar19);
    }
    pvVar8 = *(void **)((long)msp + 0x10);
    if (pvVar8 <= *(void **)((long)msp + 0x28)) {
      return pvVar8;
    }
    *(undefined8 *)((long)msp + 0x28) = 0xffffffffffffffff;
    return pvVar8;
  }
  if (puVar20 == *(ulong **)((long)msp + 0x18)) {
    uVar23 = uVar23 + *(long *)((long)msp + 8);
    *(ulong *)((long)msp + 8) = uVar23;
    *(ulong **)((long)msp + 0x18) = puVar6;
    puVar6[1] = uVar23 | 1;
    *(ulong *)((long)puVar6 + uVar23) = uVar23;
    return puVar6;
  }
  uVar23 = uVar23 + (uVar17 & 0xfffffffffffffffc);
  puVar10 = (ulong *)puVar13[1];
  if (uVar17 < 0x100) {
    puVar13 = (ulong *)*puVar13;
    if (puVar13 == puVar10) {
      bVar16 = (byte)(uVar17 >> 3) & 0x1f;
      *(uint *)msp = *msp & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
    }
    else {
      puVar13[3] = (ulong)puVar10;
      puVar10[2] = (ulong)puVar13;
    }
  }
  else {
    uVar17 = puVar13[4];
    if (puVar10 == puVar20) {
      if ((ulong *)puVar13[3] == (ulong *)0x0) {
        if ((ulong *)puVar13[2] == (ulong *)0x0) {
          puVar10 = (ulong *)0x0;
          goto LAB_0014161f;
        }
        puVar22 = (ulong *)puVar13[2];
        puVar4 = puVar13 + 2;
      }
      else {
        puVar22 = (ulong *)puVar13[3];
        puVar4 = puVar13 + 3;
      }
      do {
        do {
          puVar21 = puVar4;
          puVar10 = puVar22;
          puVar22 = (ulong *)puVar10[5];
          puVar4 = puVar10 + 5;
        } while ((ulong *)puVar10[5] != (ulong *)0x0);
        puVar22 = (ulong *)puVar10[4];
        puVar4 = puVar10 + 4;
      } while ((ulong *)puVar10[4] != (ulong *)0x0);
      *puVar21 = 0;
    }
    else {
      uVar19 = *puVar13;
      *(ulong **)(uVar19 + 0x18) = puVar10;
      puVar10[2] = uVar19;
    }
LAB_0014161f:
    if (uVar17 != 0) {
      uVar19 = puVar13[5];
      if (puVar20 == *(ulong **)((long)msp + uVar19 * 8 + 0x248)) {
        *(ulong **)((long)msp + uVar19 * 8 + 0x248) = puVar10;
        if (puVar10 != (ulong *)0x0) goto LAB_00141654;
        bVar16 = (byte)uVar19 & 0x1f;
        *(uint *)((long)msp + 4) =
             *(uint *)((long)msp + 4) & (-2 << bVar16 | 0xfffffffeU >> 0x20 - bVar16);
      }
      else {
        *(ulong **)(uVar17 + 0x20 + (ulong)(*(ulong **)(uVar17 + 0x20) != puVar20) * 8) = puVar10;
        if (puVar10 != (ulong *)0x0) {
LAB_00141654:
          puVar10[6] = uVar17;
          uVar17 = puVar13[2];
          if (uVar17 != 0) {
            puVar10[4] = uVar17;
            *(ulong **)(uVar17 + 0x30) = puVar10;
          }
          uVar17 = puVar13[3];
          if (uVar17 != 0) {
            puVar10[5] = uVar17;
            *(ulong **)(uVar17 + 0x30) = puVar10;
          }
        }
      }
    }
  }
  puVar6[1] = uVar23 | 1;
  *(ulong *)((long)puVar6 + uVar23) = uVar23;
  if (puVar6 == *(ulong **)((long)msp + 0x18)) {
    *(ulong *)((long)msp + 8) = uVar23;
    return puVar6;
  }
LAB_001412e7:
  if (uVar23 < 0x100) {
    uVar23 = uVar23 >> 3;
    uVar17 = (long)msp + uVar23 * 0x10 + 0x38;
    if ((*msp >> ((uint)uVar23 & 0x1f) & 1) == 0) {
      *(uint *)msp = *msp | 1 << ((byte)uVar23 & 0x1f);
      uVar19 = uVar17;
    }
    else {
      uVar19 = *(ulong *)((long)msp + uVar23 * 0x10 + 0x48);
    }
    *(ulong **)((long)msp + uVar23 * 0x10 + 0x48) = puVar6;
    *(ulong **)(uVar19 + 0x18) = puVar6;
    puVar6[2] = uVar19;
    puVar6[3] = uVar17;
  }
  else {
    uVar12 = (uint)(uVar23 >> 8);
    if (uVar12 == 0) {
      uVar17 = 0;
    }
    else {
      uVar17 = 0x1f;
      if (uVar12 < 0x10000) {
        uVar3 = 0x1f;
        if (uVar12 != 0) {
          for (; uVar12 >> uVar3 == 0; uVar3 = uVar3 - 1) {
          }
        }
        uVar17 = (ulong)((uint)((uVar23 >> ((ulong)(byte)(0x26 - (char)(uVar3 ^ 0x1f)) & 0x3f) & 1)
                               != 0) | (uVar3 ^ 0x1f) * 2 ^ 0x3e);
      }
    }
    puVar13 = (ulong *)((long)msp + uVar17 * 8 + 0x248);
    puVar6[7] = uVar17;
    puVar6[4] = 0;
    puVar6[5] = 0;
    if ((*(uint *)((long)msp + 4) >> ((uint)uVar17 & 0x1f) & 1) == 0) {
      *(uint *)((long)msp + 4) = *(uint *)((long)msp + 4) | 1 << ((byte)uVar17 & 0x1f);
      puVar20 = puVar13;
    }
    else {
      bVar16 = 0x39 - (char)(uVar17 >> 1);
      if (uVar17 == 0x1f) {
        bVar16 = 0;
      }
      lVar15 = uVar23 << (bVar16 & 0x3f);
      puVar13 = (ulong *)*puVar13;
      do {
        puVar10 = puVar13;
        if ((puVar10[1] & 0xfffffffffffffffc) == uVar23) {
          puVar13 = puVar10 + 2;
          puVar20 = (ulong *)puVar10[2];
          puVar20[3] = (ulong)puVar6;
          lVar15 = 0x30;
          lVar18 = 0x10;
          puVar22 = (ulong *)0x0;
          goto LAB_00141512;
        }
        lVar18 = lVar15 >> 0x3f;
        lVar15 = lVar15 * 2;
        puVar13 = (ulong *)puVar10[4 - lVar18];
      } while ((ulong *)puVar10[4 - lVar18] != (ulong *)0x0);
      puVar13 = puVar10 + (4 - lVar18);
      puVar20 = puVar10;
    }
    lVar18 = 0x30;
    lVar15 = 0x10;
    puVar10 = puVar6;
    puVar22 = puVar6;
LAB_00141512:
    *puVar13 = (ulong)puVar6;
    *(ulong **)((long)puVar6 + lVar18) = puVar20;
    puVar6[3] = (ulong)puVar10;
    *(ulong **)((long)puVar6 + lVar15) = puVar22;
    plVar11 = (long *)((long)msp + 0x30);
    *plVar11 = *plVar11 + -1;
    if (*plVar11 == 0) {
      pvVar8 = (void *)release_unused_segments((mstate)msp);
      return pvVar8;
    }
  }
  return puVar6;
}

Assistant:

static LJ_NOINLINE void *lj_alloc_free(void *msp, void *ptr)
{
  if (ptr != 0) {
    mchunkptr p = mem2chunk(ptr);
    mstate fm = (mstate)msp;
    size_t psize = chunksize(p);
    mchunkptr next = chunk_plus_offset(p, psize);
    if (!pinuse(p)) {
      size_t prevsize = p->prev_foot;
      if ((prevsize & IS_DIRECT_BIT) != 0) {
	prevsize &= ~IS_DIRECT_BIT;
	psize += prevsize + DIRECT_FOOT_PAD;
	CALL_MUNMAP((char *)p - prevsize, psize);
	return NULL;
      } else {
	mchunkptr prev = chunk_minus_offset(p, prevsize);
	psize += prevsize;
	p = prev;
	/* consolidate backward */
	if (p != fm->dv) {
	  unlink_chunk(fm, p, prevsize);
	} else if ((next->head & INUSE_BITS) == INUSE_BITS) {
	  fm->dvsize = psize;
	  set_free_with_pinuse(p, psize, next);
	  return NULL;
	}
      }
    }
    if (!cinuse(next)) {  /* consolidate forward */
      if (next == fm->top) {
	size_t tsize = fm->topsize += psize;
	fm->top = p;
	p->head = tsize | PINUSE_BIT;
	if (p == fm->dv) {
	  fm->dv = 0;
	  fm->dvsize = 0;
	}
	if (tsize > fm->trim_check)
	  alloc_trim(fm, 0);
	return NULL;
      } else if (next == fm->dv) {
	size_t dsize = fm->dvsize += psize;
	fm->dv = p;
	set_size_and_pinuse_of_free_chunk(p, dsize);
	return NULL;
      } else {
	size_t nsize = chunksize(next);
	psize += nsize;
	unlink_chunk(fm, next, nsize);
	set_size_and_pinuse_of_free_chunk(p, psize);
	if (p == fm->dv) {
	  fm->dvsize = psize;
	  return NULL;
	}
      }
    } else {
      set_free_with_pinuse(p, psize, next);
    }

    if (is_small(psize)) {
      insert_small_chunk(fm, p, psize);
    } else {
      tchunkptr tp = (tchunkptr)p;
      insert_large_chunk(fm, tp, psize);
      if (--fm->release_checks == 0)
	release_unused_segments(fm);
    }
  }
  return NULL;
}